

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float3 *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pTVar1;
  size_type *psVar2;
  undefined1 *puVar3;
  void *pvVar4;
  undefined8 uVar5;
  size_type sVar6;
  undefined4 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined4 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  bool bVar13;
  char cVar14;
  undefined1 uVar15;
  int iVar16;
  char *pcVar17;
  ostream *poVar18;
  long *plVar19;
  const_iterator cVar20;
  long *plVar21;
  mapped_type *pmVar22;
  _Base_ptr p_Var23;
  Property *args;
  size_type __n;
  _Base_ptr p_Var24;
  _Rb_tree_node_base *p_Var25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  size_t i;
  ulong uVar26;
  _Rb_tree_node_base *__k;
  long lVar27;
  ParseResult ret;
  optional<std::array<float,_3UL>_> pv;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e_1;
  stringstream ss;
  _Alloc_hider in_stack_fffffffffffffa18;
  undefined1 local_5e0 [8];
  undefined1 local_5d8 [24];
  undefined1 local_5c0 [8];
  undefined1 local_5b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5a8;
  undefined1 local_598 [72];
  UsdPrimvarReader_float3 *local_550;
  storage_t<double> local_548;
  _Rb_tree_node_base *local_540;
  storage_t<tinyusdz::Token> local_538;
  optional<std::array<float,_3UL>_> local_518;
  undefined1 local_508 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8 [2];
  optional<std::array<float,_3UL>_> local_498;
  undefined1 local_488 [16];
  undefined1 local_478 [24];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_460 [2];
  ios_base local_418 [264];
  string local_310 [16];
  long local_300 [2];
  string local_2f0 [16];
  undefined8 local_2e0 [2];
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  Variability VStack_290;
  undefined4 uStack_28c;
  undefined8 uStack_288;
  undefined1 local_280;
  undefined7 uStack_27f;
  undefined1 auStack_278 [16];
  storage_union sStack_268;
  undefined8 local_258;
  undefined1 auStack_250 [32];
  ios_base aiStack_230 [8];
  undefined1 local_228 [16];
  undefined1 local_218;
  optional<tinyusdz::Interpolation> local_210;
  optional<unsigned_int> oStack_208;
  size_t local_200;
  pointer pSStack_1f8;
  storage_t<tinyusdz::value::StringData> local_1f0;
  undefined1 local_1c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined8 uStack_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  undefined1 auStack_170 [32];
  _Alloc_hider local_150;
  undefined1 auStack_148 [32];
  size_type local_128;
  storage_t<tinyusdz::Token> sStack_120;
  pointer local_100;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  sStack_f8;
  undefined1 local_c8 [48];
  undefined1 auStack_98 [24];
  storage_t<tinyusdz::Animatable<tinyusdz::Token>_> local_80 [16];
  storage_t<tinyusdz::Token> local_70;
  storage_t<double> sStack_50;
  bool bStack_48;
  undefined7 local_47;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  
  local_508._24_8_ = (long)local_508 + 8;
  local_508._8_4_ = 0;
  local_508._16_8_ = (_Link_type)0x0;
  local_508._40_8_ = 0;
  local_548 = (storage_t<double>)warn;
  local_508._32_8_ = local_508._24_8_;
  local_2b0._0_8_ = local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT17(local_2a0[7],
                             CONCAT16(local_2a0[6],
                                      CONCAT24(local_2a0._4_2_,
                                               CONCAT22(local_2a0._2_2_,local_2a0._0_2_)))) + 1);
  }
  p_Var23 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var25 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar13 = true;
  if (p_Var23 != p_Var25) {
    local_598._56_8_ = &preader->fallback;
    local_4d8[1].field_2._0_8_ = &(preader->fallback)._paths;
    local_4d8[1]._M_dataplus._M_p = &(preader->fallback)._attrib.has_value_;
    local_598._64_8_ = &preader->varname;
    local_4d8[1].field_2._8_8_ = &preader->result;
    local_4d8[1]._M_string_length = (size_type)&(preader->super_ShaderNode).super_UsdShadePrim.props
    ;
    local_598._32_8_ = err;
    local_550 = preader;
    do {
      local_4d8[0]._M_dataplus._M_p = (pointer)&local_4d8[0].field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_4d8,*(long *)(p_Var23 + 1),
                 (long)&(p_Var23[1]._M_parent)->_M_color + *(long *)(p_Var23 + 1));
      local_598._40_8_ = p_Var23 + 2;
      local_598._0_8_ = local_598 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"inputs:fallback","");
      sVar6 = local_4d8[0]._M_string_length;
      uVar5 = local_598._8_8_;
      local_5b8._0_8_ = &aStack_5a8;
      local_5b8._8_8_ = (char *)0x0;
      aStack_5a8._0_8_ = aStack_5a8._0_8_ & 0xffffffffffffff00;
      __n = local_4d8[0]._M_string_length;
      if ((ulong)local_598._8_8_ < local_4d8[0]._M_string_length) {
        __n = local_598._8_8_;
      }
      if (__n == 0) {
        if (local_4d8[0]._M_string_length == local_598._8_8_) goto LAB_0022deff;
LAB_0022e23c:
        local_5c0._0_4_ = 1;
      }
      else {
        iVar16 = bcmp(local_4d8[0]._M_dataplus._M_p,(void *)local_598._0_8_,__n);
        if ((sVar6 != uVar5) || (iVar16 != 0)) goto LAB_0022e23c;
LAB_0022deff:
        uVar12 = local_488._6_2_;
        uVar11 = local_488._4_2_;
        uVar10 = local_488._0_4_;
        local_488._4_2_ = (undefined2)((ulong)local_478 >> 0x20);
        uVar8 = local_488._4_2_;
        local_488._6_2_ = (undefined2)((ulong)local_478 >> 0x30);
        uVar9 = local_488._6_2_;
        local_488._0_4_ = SUB84(local_478,0);
        uVar7 = local_488._0_4_;
        if (((ulong)p_Var23[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_5c0._0_4_ = 7;
          in_stack_fffffffffffffa18._M_p = &DAT_0000003e;
          pcVar17 = (char *)::std::__cxx11::string::_M_create
                                      ((ulong *)local_488,(ulong)&stack0xfffffffffffffa18);
          local_488._0_4_ = SUB84(pcVar17,0);
          local_488._4_2_ = (undefined2)((ulong)pcVar17 >> 0x20);
          local_488._6_2_ = (undefined2)((ulong)pcVar17 >> 0x30);
          builtin_strncpy(pcVar17,"Property `{}` must be Attribute, but declared as Relationship.",
                          0x3e);
          local_488._8_4_ = SUB84(in_stack_fffffffffffffa18._M_p,0);
          local_488._12_2_ = (undefined2)((ulong)in_stack_fffffffffffffa18._M_p >> 0x20);
          local_488._14_2_ = (undefined2)((ulong)in_stack_fffffffffffffa18._M_p >> 0x30);
          pcVar17[(long)in_stack_fffffffffffffa18._M_p] = '\0';
          local_478._0_8_ = in_stack_fffffffffffffa18._M_p;
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_488,(string *)local_598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa18._M_p);
          ::std::__cxx11::string::operator=((string *)local_5b8,(string *)local_2b0);
          if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT17(local_2a0[7],
                                     CONCAT16(local_2a0[6],
                                              CONCAT24(local_2a0._4_2_,
                                                       CONCAT22(local_2a0._2_2_,local_2a0._0_2_))))
                            + 1);
          }
          pcVar17 = (char *)CONCAT26(local_488._6_2_,CONCAT24(local_488._4_2_,local_488._0_4_));
          uVar10 = local_488._0_4_;
          uVar11 = local_488._4_2_;
          uVar12 = local_488._6_2_;
          if (pcVar17 != local_478) {
            operator_delete(pcVar17,(ulong)(local_478._0_8_ + 1));
            uVar10 = local_488._0_4_;
            uVar11 = local_488._4_2_;
            uVar12 = local_488._6_2_;
          }
        }
        local_488._6_2_ = uVar12;
        local_488._4_2_ = uVar11;
        local_488._0_4_ = uVar10;
        if (p_Var23[6]._M_left != p_Var23[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     local_4d8[1].field_2._0_8_,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var23[6]._M_parent);
          local_5c0 = (undefined1  [8])((ulong)local_5c0 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_
                  ((string *)&stack0xfffffffffffffa18,(Attribute *)local_598._40_8_);
        local_2b0._0_8_ = local_2a0;
        local_2a0._4_2_ = 0x3374;
        local_2a0._0_2_ = 0x6c66;
        local_2a0._2_2_ = 0x616f;
        local_2b0._8_4_ = 6;
        local_2b0._12_2_ = 0;
        local_2b0._14_2_ = 0;
        local_2a0[6] = '\0';
        if (local_5e0 == (undefined1  [8])0x6) {
          if (*(short *)(in_stack_fffffffffffffa18._M_p + 4) != 0x3374 ||
              *(int *)in_stack_fffffffffffffa18._M_p != 0x616f6c66) {
            local_488._8_4_ = 6;
            local_488._12_2_ = 0;
            local_488._14_2_ = 0;
            local_478._0_7_ = 0x3374616f6c66;
            local_488._0_4_ = uVar7;
            local_488._4_2_ = uVar8;
            local_488._6_2_ = uVar9;
            if (*(short *)(in_stack_fffffffffffffa18._M_p + 4) != 0x3374 ||
                *(int *)in_stack_fffffffffffffa18._M_p != 0x616f6c66) goto LAB_0022e0d0;
          }
          iVar16 = *(int *)((long)&p_Var23[0x17]._M_parent + 4);
          if (iVar16 == 1) {
            if (p_Var23[5]._M_left == p_Var23[5]._M_parent) {
              if (p_Var23[4]._M_right == (_Base_ptr)0x0) {
                bVar13 = false;
              }
              else {
                iVar16 = (**(code **)p_Var23[4]._M_right)();
                bVar13 = iVar16 == 4;
              }
              uVar15 = (undefined1)p_Var23[5]._M_color;
              if ((bVar13) || ((uVar15 & _S_black) != _S_red)) {
                (local_550->fallback)._blocked = true;
              }
            }
            else {
              uVar15 = (undefined1)p_Var23[5]._M_color;
            }
            if (((((uVar15 & _S_black) == _S_red) && (p_Var23[4]._M_right != (_Base_ptr)0x0)) &&
                ((iVar16 = (**(code **)p_Var23[4]._M_right)(), iVar16 == 0 ||
                 ((p_Var23[4]._M_right != (_Base_ptr)0x0 &&
                  (iVar16 = (**(code **)p_Var23[4]._M_right)(), iVar16 == 1)))))) &&
               (p_Var23[5]._M_left == p_Var23[5]._M_parent)) {
              if (p_Var23[6]._M_left == p_Var23[6]._M_parent) goto LAB_0022e216;
              AttrMetas::operator=((AttrMetas *)local_598._56_8_,(AttrMetas *)(p_Var23 + 7));
              __v = local_4d8;
              goto LAB_0022e481;
            }
            local_478[0x10] = false;
            local_478._17_7_ = 0;
            local_460[0]._0_1_ = 0;
            local_478._0_8_ =
                 (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
            local_478._8_4_ = Varying;
            local_478._12_4_ = 0;
            local_488._8_4_ = 0;
            local_488._12_2_ = 0;
            local_488._0_4_ = 0;
            local_488._4_2_ = 0;
            local_488._6_2_ = 0;
            bVar13 = primvar::PrimVar::is_valid((PrimVar *)&p_Var23[4]._M_parent);
            if (bVar13) {
              local_598._48_8_ = p_Var25;
              if ((((char)p_Var23[5]._M_color == _S_red) && (p_Var23[4]._M_right != (_Base_ptr)0x0))
                 && ((iVar16 = (**(code **)p_Var23[4]._M_right)(), iVar16 == 0 ||
                     ((p_Var23[4]._M_right != (_Base_ptr)0x0 &&
                      (iVar16 = (**(code **)p_Var23[4]._M_right)(), iVar16 == 1)))))) {
                cVar14 = '\0';
              }
              else {
                primvar::PrimVar::get_value<std::array<float,3ul>>
                          (&local_518,(PrimVar *)&p_Var23[4]._M_parent);
                cVar14 = local_518.has_value_;
                if (local_518.has_value_ != false) {
                  local_498.contained._7_4_ = local_518.contained._8_4_;
                  local_498._3_1_ = SUB81(local_518.contained._0_8_,0);
                  local_498.contained._0_7_ = (undefined7)((ulong)local_518.contained._0_8_ >> 8);
                  local_488._0_4_ = (undefined4)local_518.contained._0_8_;
                  local_488._4_2_ = (undefined2)((ulong)local_518.contained._0_8_ >> 0x20);
                  local_488._6_2_ = (undefined2)((ulong)local_518.contained._0_8_ >> 0x30);
                  local_488._8_4_ = local_518.contained._8_4_;
                  local_488._12_2_ = 1;
                }
              }
              p_Var24 = p_Var23[5]._M_parent;
              if (p_Var23[5]._M_left == p_Var24) {
                p_Var25 = (_Rb_tree_node_base *)local_598._48_8_;
                if (cVar14 == '\0') goto LAB_0022f5ba;
                local_2a0._8_4_ = 0;
                local_2a0._12_4_ = 0;
                VStack_290 = Varying;
                uStack_28c = 0;
                uVar15 = 0;
                uStack_288 = (pointer)0x0;
              }
              else {
                lVar27 = 0;
                uVar26 = 0;
                do {
                  if ((char)p_Var23[6]._M_color == _S_black) {
                    tinyusdz::value::TimeSamples::update((TimeSamples *)&p_Var23[5]._M_parent);
                    p_Var24 = p_Var23[5]._M_parent;
                  }
                  if (*(char *)((long)&p_Var24[1]._M_color + lVar27) == '\x01') {
                    TypedTimeSamples<std::array<float,_3UL>_>::add_blocked_sample
                              ((TypedTimeSamples<std::array<float,_3UL>_> *)local_478,
                               *(double *)((long)&p_Var24->_M_color + lVar27));
                  }
                  else {
                    tinyusdz::value::Value::get_value<std::array<float,3ul>>
                              (&local_498,(Value *)((long)&p_Var24->_M_parent + lVar27),false);
                    p_Var25 = (_Rb_tree_node_base *)local_598._48_8_;
                    local_518.has_value_ = local_498.has_value_;
                    if (local_498.has_value_ != true) {
                      if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_478._0_8_ !=
                          (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x0) {
                        operator_delete((void *)local_478._0_8_,
                                        CONCAT71(local_478._17_7_,local_478[0x10]) - local_478._0_8_
                                       );
                      }
                      goto LAB_0022f5ba;
                    }
                    local_518.contained._8_4_ =
                         CONCAT13(local_498.contained._11_1_,local_498.contained._8_3_);
                    local_518.contained._7_1_ = local_498.contained._7_1_;
                    local_518.contained._0_7_ = local_498.contained._0_7_;
                    TypedTimeSamples<std::array<float,_3UL>_>::add_sample
                              ((TypedTimeSamples<std::array<float,_3UL>_> *)local_478,
                               *(double *)((long)&p_Var24->_M_color + lVar27),
                               (array<float,_3UL> *)&local_518.contained);
                  }
                  uVar26 = uVar26 + 1;
                  p_Var24 = p_Var23[5]._M_parent;
                  lVar27 = lVar27 + 0x28;
                } while (uVar26 < (ulong)(((long)p_Var23[5]._M_left - (long)p_Var24 >> 3) *
                                         -0x3333333333333333));
                uStack_288 = CONCAT71(local_478._17_7_,local_478[0x10]);
                local_2a0._8_4_ = local_478._0_4_;
                local_2a0._12_4_ = local_478._4_4_;
                VStack_290 = local_478._8_4_;
                uStack_28c = local_478._12_4_;
                uVar15 = local_460[0]._0_1_;
              }
              p_Var25 = (_Rb_tree_node_base *)local_598._48_8_;
              local_538._15_1_ = (undefined1)local_488._8_4_;
              local_538._16_5_ =
                   (undefined5)
                   (CONCAT26(local_488._12_2_,CONCAT42(local_488._8_4_,local_488._6_2_)) >> 0x18);
              local_538._7_1_ = (undefined1)local_488._0_4_;
              local_538._8_5_ = (undefined5)(CONCAT24(local_488._4_2_,local_488._0_4_) >> 8);
              local_538._13_2_ = local_488._6_2_;
              local_2b0[0] = 1;
              local_2a0._0_2_ =
                   (undefined2)
                   (CONCAT53(local_538._16_5_,CONCAT12(local_538._15_1_,local_488._6_2_)) >> 0x10);
              local_2a0._2_2_ = SUB42(local_488._8_4_,2);
              local_2a0._4_2_ = local_488._12_2_;
              local_2b0._8_4_ = local_488._0_4_;
              local_2b0._12_2_ = local_488._4_2_;
              local_2b0._14_2_ = local_488._6_2_;
              local_280 = uVar15;
              nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,3ul>>>::
              operator=((optional<tinyusdz::Animatable<std::array<float,3ul>>> *)
                        local_4d8[1]._M_dataplus._M_p,
                        (Animatable<std::array<float,_3UL>_> *)(local_2b0 + 8));
              if (((local_2b0._0_8_ & 1) != 0) &&
                 (pvVar4 = (void *)CONCAT44(local_2a0._12_4_,local_2a0._8_4_), pvVar4 != (void *)0x0
                 )) {
                operator_delete(pvVar4,uStack_288 - (long)pvVar4);
              }
              goto LAB_0022e460;
            }
LAB_0022f5ba:
            local_5c0._0_4_ = 8;
            warn = (string *)0x55;
            ::std::__cxx11::string::_M_replace((ulong)local_5b8,0,(char *)local_5b8._8_8_,0x3a2fb6);
          }
          else if (iVar16 == 0) {
            (local_550->fallback)._value_empty = true;
LAB_0022e460:
            AttrMetas::operator=((AttrMetas *)local_598._56_8_,(AttrMetas *)(p_Var23 + 7));
            __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598;
LAB_0022e481:
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_508,__v);
            local_5c0 = (undefined1  [8])((ulong)local_5c0 & 0xffffffff00000000);
          }
          else {
            warn = (string *)0x25;
            ::std::__cxx11::string::_M_replace((ulong)local_5b8,0,(char *)local_5b8._8_8_,0x3a2ce8);
            local_5c0._0_4_ = 8;
          }
        }
        else {
LAB_0022e0d0:
          local_5c0._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,"Property type mismatch. ",0x18);
          poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0,(char *)local_598._0_8_,local_598._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar18," expects type `",0xf);
          local_488._8_4_ = 6;
          local_488._12_2_ = 0;
          local_488._14_2_ = 0;
          local_478._0_7_ = 0x3374616f6c66;
          local_488._0_4_ = uVar7;
          local_488._4_2_ = uVar8;
          local_488._6_2_ = uVar9;
          poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,local_478,6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,"` but defined as type `",0x17);
          poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar18,in_stack_fffffffffffffa18._M_p,(long)local_5e0);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"`",1);
          pcVar17 = (char *)CONCAT26(local_488._6_2_,CONCAT24(local_488._4_2_,local_488._0_4_));
          if (pcVar17 != local_478) {
            operator_delete(pcVar17,(ulong)(local_478._0_8_ + 1));
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)local_5b8,(string *)local_488);
          pcVar17 = (char *)CONCAT26(local_488._6_2_,CONCAT24(local_488._4_2_,local_488._0_4_));
          if (pcVar17 != local_478) {
            operator_delete(pcVar17,(ulong)(local_478._0_8_ + 1));
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base(aiStack_230);
        }
LAB_0022e216:
        if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa18._M_p !=
            (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5d8) {
          operator_delete(in_stack_fffffffffffffa18._M_p,(ulong)(local_5d8._0_8_ + 1));
        }
      }
      if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
        operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8[0]._M_dataplus._M_p != &local_4d8[0].field_2) {
        operator_delete(local_4d8[0]._M_dataplus._M_p,local_4d8[0].field_2._M_allocated_capacity + 1
                       );
      }
      uVar12 = local_488._6_2_;
      uVar11 = local_488._4_2_;
      uVar10 = local_488._0_4_;
      iVar16 = 0;
      local_488._4_2_ = (undefined2)((ulong)local_478 >> 0x20);
      uVar8 = local_488._4_2_;
      local_488._6_2_ = (undefined2)((ulong)local_478 >> 0x30);
      uVar9 = local_488._6_2_;
      local_488._0_4_ = SUB84(local_478,0);
      uVar7 = local_488._0_4_;
      local_488._0_4_ = uVar10;
      local_488._4_2_ = uVar11;
      local_488._6_2_ = uVar12;
      if (((ulong)local_5c0 & 0xfffffffd) == 0) {
        iVar16 = 3;
LAB_0022e52b:
        bVar13 = false;
      }
      else {
        bVar13 = true;
        if (local_5c0._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar18 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x10b9);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar18," ",1);
          in_stack_fffffffffffffa18._M_p = (pointer)local_5d8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffa18,"Parsing attribute `{}` failed. Error: {}",
                     "");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_488,(fmt *)&stack0xfffffffffffffa18,(string *)"inputs:fallback"
                     ,(char (*) [16])local_5b8,warn);
          poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,
                               (char *)CONCAT26(local_488._6_2_,
                                                CONCAT24(local_488._4_2_,local_488._0_4_)),
                               CONCAT26(local_488._14_2_,CONCAT24(local_488._12_2_,local_488._8_4_))
                              );
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
          puVar3 = (undefined1 *)CONCAT26(local_488._6_2_,CONCAT24(local_488._4_2_,local_488._0_4_))
          ;
          if (puVar3 != local_478) {
            operator_delete(puVar3,(ulong)(local_478._0_8_ + 1));
          }
          uVar5 = local_598._32_8_;
          if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa18._M_p !=
              (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_5d8) {
            operator_delete(in_stack_fffffffffffffa18._M_p,(ulong)(local_5d8._0_8_ + 1));
          }
          if ((string *)uVar5 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar19 = (long *)::std::__cxx11::string::_M_append
                                        (&stack0xfffffffffffffa18,*(ulong *)uVar5);
            lVar27 = *plVar19;
            plVar21 = plVar19 + 2;
            if ((long *)lVar27 == plVar21) {
              local_478._0_8_ = *plVar21;
              local_478._8_4_ = (undefined4)plVar19[3];
              local_478._12_4_ = (undefined4)((ulong)plVar19[3] >> 0x20);
              local_488._0_4_ = uVar7;
              local_488._4_2_ = uVar8;
              local_488._6_2_ = uVar9;
            }
            else {
              local_488._0_4_ = (undefined4)lVar27;
              local_488._4_2_ = (undefined2)((ulong)lVar27 >> 0x20);
              local_488._6_2_ = (undefined2)((ulong)lVar27 >> 0x30);
              local_478._0_8_ = *plVar21;
            }
            lVar27 = plVar19[1];
            local_488._8_4_ = (undefined4)lVar27;
            local_488._12_2_ = (undefined2)((ulong)lVar27 >> 0x20);
            local_488._14_2_ = (undefined2)((ulong)lVar27 >> 0x30);
            *plVar19 = (long)plVar21;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)uVar5,(string *)local_488);
            puVar3 = (undefined1 *)
                     CONCAT26(local_488._6_2_,CONCAT24(local_488._4_2_,local_488._0_4_));
            if (puVar3 != local_478) {
              operator_delete(puVar3,(ulong)(local_478._0_8_ + 1));
            }
            if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa18._M_p !=
                (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5d8) {
              operator_delete(in_stack_fffffffffffffa18._M_p,(ulong)(local_5d8._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)(auStack_250 + 0x10));
          iVar16 = 1;
          goto LAB_0022e52b;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._0_8_ != &aStack_5a8) {
        operator_delete((void *)local_5b8._0_8_,aStack_5a8._0_8_ + 1);
      }
      if (bVar13) {
        local_540 = p_Var23 + 1;
        iVar16 = ::std::__cxx11::string::compare((char *)local_540);
        if (iVar16 == 0) {
          local_2b0._0_8_ = local_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"inputs:varname","")
          ;
          cVar20 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_508,(key_type *)local_2b0);
          if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT17(local_2a0[7],
                                     CONCAT16(local_2a0[6],
                                              CONCAT24(local_2a0._4_2_,
                                                       CONCAT22(local_2a0._2_2_,local_2a0._0_2_))))
                            + 1);
          }
          if (cVar20._M_node == (_Base_ptr)(local_508 + 8)) {
            local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
            local_2b0._8_4_ = local_2b0._8_4_ & 0xffffff00;
            local_2b0._12_2_ = 0;
            local_2b0._14_2_ = 0;
            local_2a0._0_2_ = 0;
            local_2a0._8_4_ = local_2a0._8_4_ & 0xffffff00;
            local_228._8_8_ = (pointer)0x0;
            local_218 = 0;
            local_100 = (pointer)0x0;
            sStack_f8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            sStack_120._16_8_ = 0;
            sStack_120._24_8_ = 0;
            sStack_f8._16_4_ = 0;
            sStack_f8._24_8_ = 0;
            sStack_268._8_1_ = 0;
            auStack_278._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            sStack_268.dynamic = (void *)0x0;
            _local_280 = 0;
            auStack_278._0_8_ = 0;
            VStack_290 = Varying;
            uStack_28c._0_1_ = false;
            uStack_28c._1_3_ = 0;
            uStack_288 = (pointer)0x0;
            local_228[0] = 0;
            auStack_250._24_8_ = (pointer)0x0;
            aiStack_230[0] = (ios_base)0x0;
            aiStack_230[1] = (ios_base)0x0;
            aiStack_230[2] = (ios_base)0x0;
            aiStack_230[3] = (ios_base)0x0;
            aiStack_230[4] = (ios_base)0x0;
            aiStack_230[5] = (ios_base)0x0;
            aiStack_230[6] = (ios_base)0x0;
            aiStack_230[7] = (ios_base)0x0;
            auStack_250._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_250._16_8_ = (pointer)0x0;
            local_258 = (vtable_type *)0x0;
            auStack_250._0_8_ = 0;
            local_1f0._0_1_ = 0;
            local_200 = 0;
            pSStack_1f8 = (pointer)0x0;
            local_210.has_value_ = false;
            local_210._1_3_ = 0;
            local_210.contained = (storage_t<tinyusdz::Interpolation>)0x0;
            oStack_208.has_value_ = false;
            oStack_208._1_3_ = 0;
            oStack_208.contained = (storage_t<unsigned_int>)0x0;
            local_1f0._40_1_ = 0;
            local_1f0._24_8_ = 0;
            local_1f0._32_8_ = 0;
            local_1f0._8_8_ = 0;
            local_1f0._16_8_ = 0;
            local_1a0._M_local_buf[0] = '\0';
            local_1c0._16_8_ = 0;
            local_1c0._24_8_ = 0;
            local_1c0._0_8_ = 0;
            local_1c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_170[8] = 0;
            aStack_180._8_8_ = 0;
            auStack_170._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_188 = 0;
            aStack_180._M_allocated_capacity = 0;
            local_1a0._8_8_ = 0;
            uStack_190 = 0;
            auStack_148[8] = '\0';
            local_150._M_p = (pointer)0x0;
            auStack_148._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_170._16_8_ = 0;
            auStack_170._24_8_ = 0;
            sStack_120._8_1_ = 0;
            local_128 = 0;
            sStack_120.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_148._16_8_ = 0;
            auStack_148._24_8_ = 0;
            sStack_f8._32_8_ = (long)&sStack_f8 + 0x10;
            local_c8[0x20] = 0;
            local_c8._16_8_ = 0;
            local_c8._24_8_ = 0;
            local_c8._0_8_ = 0;
            local_c8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_98[8] = 0;
            auStack_98._9_8_ = 0;
            local_c8._40_8_ = 0;
            auStack_98[0] = 0;
            auStack_98._1_7_ = 0;
            uStack_40 = 0;
            uStack_3f = 0;
            sStack_50 = (storage_t<double>)0x0;
            bStack_48 = false;
            local_47 = 0;
            local_70._16_8_ = 0;
            local_70._24_8_ = 0;
            local_70.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_70._8_8_ = 0;
            local_80[0] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[1] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[2] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[3] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[4] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[5] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[6] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[7] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[8] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[9] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[10] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[0xb] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[0xc] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[0xd] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[0xe] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[0xf] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_2d0._0_8_ = (long)local_2d0 + 0x10;
            sStack_f8._40_8_ = sStack_f8._32_8_;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2d0,*(long *)(p_Var23 + 1),
                       (long)&(p_Var23[1]._M_parent)->_M_color + *(long *)(p_Var23 + 1));
            warn = (string *)local_488;
            local_488._0_4_ = uVar7;
            local_488._4_2_ = uVar8;
            local_488._6_2_ = uVar9;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
            anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                      ((ParseResult *)local_5c0,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_508,(string *)local_2d0,(Property *)local_598._40_8_,warn,
                       (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
            puVar3 = (undefined1 *)
                     CONCAT26(local_488._6_2_,CONCAT24(local_488._4_2_,local_488._0_4_));
            if (puVar3 != local_478) {
              operator_delete(puVar3,(ulong)(local_478._0_8_ + 1));
            }
            if (local_2d0._0_8_ != (long)local_2d0 + 0x10) {
              operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
            }
            if (local_5c0._0_4_ == TypeMismatch) {
              local_2f0._0_8_ = local_2e0;
              ::std::__cxx11::string::_M_construct<char*>
                        (local_2f0,*(long *)(p_Var23 + 1),
                         (long)&(p_Var23[1]._M_parent)->_M_color + *(long *)(p_Var23 + 1));
              warn = (string *)local_488;
              local_488._0_4_ = uVar7;
              local_488._4_2_ = uVar8;
              local_488._6_2_ = uVar9;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
              args = (Property *)local_598._40_8_;
              (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                        ((ParseResult *)&stack0xfffffffffffffa18,(_anonymous_namespace_ *)local_508,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f0,(string *)local_598._40_8_,(Property *)warn,
                         (string *)local_598._64_8_,
                         (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffa18._M_p);
              puVar3 = (undefined1 *)
                       CONCAT26(local_488._6_2_,CONCAT24(local_488._4_2_,local_488._0_4_));
              if (puVar3 != local_478) {
                operator_delete(puVar3,(ulong)(local_478._0_8_ + 1));
              }
              uVar5 = local_598._32_8_;
              if ((undefined8 *)local_2f0._0_8_ != local_2e0) {
                operator_delete((void *)local_2f0._0_8_,local_2e0[0] + 1);
              }
              if ((ResultCode)in_stack_fffffffffffffa18._M_p == Success) {
                iVar16 = 3;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_488,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_488,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_488,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"():",3);
                poVar18 = (ostream *)::std::ostream::operator<<((ostringstream *)local_488,0x10d2);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar18," ",1);
                local_538._0_7_ = (undefined7)((long)&local_538 + 0x10);
                local_538._7_1_ = (undefined1)((ulong)((long)&local_538 + 0x10) >> 0x38);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_538,"Faied to parse inputs:varname: {}","");
                fmt::format<std::__cxx11::string>
                          ((string *)local_598,(fmt *)&local_538,(string *)local_5e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                pcVar17 = local_598 + 0x10;
                poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_488,(char *)local_598._0_8_,local_598._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
                if ((char *)local_598._0_8_ != pcVar17) {
                  operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
                }
                if ((void *)CONCAT17(local_538._7_1_,local_538._0_7_) !=
                    (void *)((long)&local_538 + 0x10)) {
                  operator_delete((void *)CONCAT17(local_538._7_1_,local_538._0_7_),
                                  CONCAT35(local_538._21_3_,local_538._16_5_) + 1);
                }
                if ((string *)uVar5 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar21 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_538,*(ulong *)uVar5);
                  psVar2 = (size_type *)(plVar21 + 2);
                  if ((size_type *)*plVar21 == psVar2) {
                    local_598._16_8_ = *psVar2;
                    local_598._24_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar21 + 3);
                    local_598._0_8_ = pcVar17;
                  }
                  else {
                    local_598._16_8_ = *psVar2;
                    local_598._0_8_ = (size_type *)*plVar21;
                  }
                  local_598._8_8_ = plVar21[1];
                  *plVar21 = (long)psVar2;
                  plVar21[1] = 0;
                  *(undefined1 *)(plVar21 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)uVar5,(string *)local_598);
                  if ((char *)local_598._0_8_ != pcVar17) {
                    operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
                  }
                  if ((void *)CONCAT17(local_538._7_1_,local_538._0_7_) !=
                      (void *)((long)&local_538 + 0x10)) {
                    operator_delete((void *)CONCAT17(local_538._7_1_,local_538._0_7_),
                                    CONCAT35(local_538._21_3_,local_538._16_5_) + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
                ::std::ios_base::~ios_base(local_418);
                iVar16 = 1;
              }
              if (local_5e0 != (undefined1  [8])(local_5d8 + 8)) {
                operator_delete((void *)local_5e0,local_5d8._8_8_ + 1);
              }
            }
            else {
              iVar16 = 0;
              if (local_5c0._0_4_ == Success) {
                bVar13 = ConvertTokenAttributeToStringAttribute
                                   ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                    local_2b0,
                                    (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_598._64_8_);
                iVar16 = 3;
                if (!bVar13) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_488,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_488,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_488,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"():",3)
                  ;
                  poVar18 = (ostream *)::std::ostream::operator<<((ostringstream *)local_488,0x10c0)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar18," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_488,
                             "Failed to convert inputs:varname token type to string type.",0x3b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"\n",1);
                  uVar5 = local_598._32_8_;
                  if ((string *)local_598._32_8_ != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar21 = (long *)::std::__cxx11::string::_M_append(local_598,*(ulong *)uVar5);
                    pTVar1 = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(plVar21 + 2);
                    if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)*plVar21 == pTVar1) {
                      local_5d8._0_8_ = (pTVar1->_metas).interpolation;
                      local_5d8._8_8_ = plVar21[3];
                      in_stack_fffffffffffffa18._M_p = (pointer)local_5d8;
                    }
                    else {
                      local_5d8._0_8_ = (pTVar1->_metas).interpolation;
                      in_stack_fffffffffffffa18._M_p = (pointer)*plVar21;
                    }
                    local_5e0 = (undefined1  [8])plVar21[1];
                    *plVar21 = (long)pTVar1;
                    plVar21[1] = 0;
                    *(undefined1 *)(plVar21 + 2) = 0;
                    ::std::__cxx11::string::operator=
                              ((string *)uVar5,(string *)&stack0xfffffffffffffa18);
                    if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa18._M_p !=
                        (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_5d8) {
                      operator_delete(in_stack_fffffffffffffa18._M_p,(ulong)(local_5d8._0_8_ + 1));
                    }
                    if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
                      operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
                  ::std::ios_base::~ios_base(local_418);
                  iVar16 = 1;
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b8._0_8_ != &aStack_5a8) {
              operator_delete((void *)local_5b8._0_8_,aStack_5a8._0_8_ + 1);
            }
            if (auStack_98[0x10] == '\x01') {
              nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
              destruct_value(local_80);
            }
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_c8 + 0x28))
            ;
            AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
            if (iVar16 != 0) goto LAB_0022f7a5;
          }
        }
        local_310._0_8_ = local_300;
        ::std::__cxx11::string::_M_construct<char*>
                  (local_310,*(long *)(p_Var23 + 1),
                   (long)&(p_Var23[1]._M_parent)->_M_color + *(long *)(p_Var23 + 1));
        local_2b0._0_8_ = local_2a0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"outputs:result","");
        warn = (string *)local_2b0;
        (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,3ul>>
                  ((ParseResult *)local_488,(_anonymous_namespace_ *)local_508,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_310,(string *)local_598._40_8_,(Property *)local_2b0,
                   (string *)local_4d8[1].field_2._8_8_,
                   (TypedTerminalAttribute<std::array<float,_3UL>_> *)in_stack_fffffffffffffa18._M_p
                  );
        if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
          operator_delete((void *)local_2b0._0_8_,
                          CONCAT17(local_2a0[7],
                                   CONCAT16(local_2a0[6],
                                            CONCAT24(local_2a0._4_2_,
                                                     CONCAT22(local_2a0._2_2_,local_2a0._0_2_)))) +
                          1);
        }
        if ((long *)local_310._0_8_ != local_300) {
          operator_delete((void *)local_310._0_8_,local_300[0] + 1);
        }
        iVar16 = 0;
        if ((local_488._0_4_ & 0xfffffffd) == 0) {
          iVar16 = 3;
LAB_0022ec69:
          bVar13 = false;
        }
        else {
          bVar13 = true;
          if (local_488._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar18 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x10d8);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar18," ",1);
            in_stack_fffffffffffffa18._M_p = (pointer)local_5d8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffffa18,
                       "Parsing shader output property `{}` failed. Error: {}","");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_5c0,(fmt *)&stack0xfffffffffffffa18,
                       (string *)"outputs:result",(char (*) [15])(local_488 + 8),warn);
            poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_5c0,local_5b8._0_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
            pcVar17 = local_5b8 + 8;
            if (local_5c0 != (undefined1  [8])pcVar17) {
              operator_delete((void *)local_5c0,(ulong)(local_5b8._8_8_ + 1));
            }
            uVar5 = local_598._32_8_;
            if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa18._M_p !=
                (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5d8) {
              operator_delete(in_stack_fffffffffffffa18._M_p,(ulong)(local_5d8._0_8_ + 1));
            }
            if ((string *)uVar5 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar19 = (long *)::std::__cxx11::string::_M_append
                                          (&stack0xfffffffffffffa18,*(ulong *)uVar5);
              plVar21 = plVar19 + 2;
              if ((long *)*plVar19 == plVar21) {
                local_5b8._8_8_ = *plVar21;
                aStack_5a8._M_allocated_capacity = plVar19[3];
                local_5c0 = (undefined1  [8])pcVar17;
              }
              else {
                local_5b8._8_8_ = *plVar21;
                local_5c0 = (undefined1  [8])*plVar19;
              }
              local_5b8._0_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar19 + 1);
              *plVar19 = (long)plVar21;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)uVar5,(string *)local_5c0);
              if (local_5c0 != (undefined1  [8])pcVar17) {
                operator_delete((void *)local_5c0,(ulong)(local_5b8._8_8_ + 1));
              }
              if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffa18._M_p !=
                  (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5d8) {
                operator_delete(in_stack_fffffffffffffa18._M_p,(ulong)(local_5d8._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)(auStack_250 + 0x10));
            iVar16 = 1;
            goto LAB_0022ec69;
          }
        }
        puVar3 = (undefined1 *)CONCAT26(local_488._14_2_,CONCAT24(local_488._12_2_,local_488._8_4_))
        ;
        if (puVar3 != local_478 + 8) {
          operator_delete(puVar3,CONCAT44(local_478._12_4_,local_478._8_4_) + 1);
        }
        __k = local_540;
        if (!bVar13) goto LAB_0022f7a5;
        cVar20 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_508,(key_type *)local_540);
        if (cVar20._M_node == (_Base_ptr)(local_508 + 8)) {
          pmVar22 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                  *)local_4d8[1]._M_string_length,(key_type *)__k);
          ::std::__cxx11::string::_M_assign((string *)pmVar22);
          (pmVar22->_attrib)._varying_authored = (bool)p_Var23[3].field_0x4;
          (pmVar22->_attrib)._variability = p_Var23[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar22->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar22->_attrib)._var,(any *)&p_Var23[4]._M_parent);
          (pmVar22->_attrib)._var._blocked = SUB41(p_Var23[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&(pmVar22->_attrib)._var._ts,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var23[5]._M_parent);
          (pmVar22->_attrib)._var._ts._dirty = SUB41(p_Var23[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar22->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var23[6]._M_parent);
          AttrMetas::operator=(&(pmVar22->_attrib)._metas,(AttrMetas *)(p_Var23 + 7));
          *(_Base_ptr *)&pmVar22->_listOpQual = p_Var23[0x17]._M_parent;
          (pmVar22->_rel).type = *(Type *)&p_Var23[0x17]._M_left;
          Path::operator=(&(pmVar22->_rel).targetPath,(Path *)&p_Var23[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar22->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var23[0x1e]._M_parent);
          (pmVar22->_rel).listOpQual = p_Var23[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar22->_rel)._metas,(AttrMetas *)&p_Var23[0x1f]._M_parent);
          (pmVar22->_rel)._varying_authored = *(bool *)&p_Var23[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar22->_prop_value_type_name);
          __k = local_540;
          pmVar22->_has_custom = *(bool *)&p_Var23[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_508,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540)
          ;
        }
        cVar20 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_508,(key_type *)__k);
        if (cVar20._M_node == (_Base_ptr)(local_508 + 8)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar18 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x10da);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar18," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_488,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
          ;
          poVar18 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,
                               (char *)CONCAT26(local_488._6_2_,
                                                CONCAT24(local_488._4_2_,local_488._0_4_)),
                               CONCAT26(local_488._14_2_,CONCAT24(local_488._12_2_,local_488._8_4_))
                              );
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
          puVar3 = (undefined1 *)CONCAT26(local_488._6_2_,CONCAT24(local_488._4_2_,local_488._0_4_))
          ;
          if (puVar3 != local_478) {
            operator_delete(puVar3,(ulong)(local_478._0_8_ + 1));
          }
          uVar5 = local_598._32_8_;
          if (local_548 != (storage_t<double>)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar19 = (long *)::std::__cxx11::string::_M_append(local_5c0,*(ulong *)uVar5);
            local_488._0_4_ = SUB84(local_478,0);
            local_488._4_2_ = (undefined2)((ulong)local_478 >> 0x20);
            local_488._6_2_ = (undefined2)((ulong)local_478 >> 0x30);
            lVar27 = *plVar19;
            plVar21 = plVar19 + 2;
            if ((long *)lVar27 == plVar21) {
              local_478._0_8_ = *plVar21;
              local_478._8_4_ = (undefined4)plVar19[3];
              local_478._12_4_ = (undefined4)((ulong)plVar19[3] >> 0x20);
            }
            else {
              local_488._0_4_ = (undefined4)lVar27;
              local_488._4_2_ = (undefined2)((ulong)lVar27 >> 0x20);
              local_488._6_2_ = (undefined2)((ulong)lVar27 >> 0x30);
              local_478._0_8_ = *plVar21;
            }
            lVar27 = plVar19[1];
            local_488._8_4_ = (undefined4)lVar27;
            local_488._12_2_ = (undefined2)((ulong)lVar27 >> 0x20);
            local_488._14_2_ = (undefined2)((ulong)lVar27 >> 0x30);
            *plVar19 = (long)plVar21;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_548,(string *)local_488);
            puVar3 = (undefined1 *)
                     CONCAT26(local_488._6_2_,CONCAT24(local_488._4_2_,local_488._0_4_));
            if (puVar3 != local_478) {
              operator_delete(puVar3,(ulong)(local_478._0_8_ + 1));
            }
            if (local_5c0 != (undefined1  [8])(local_5b8 + 8)) {
              operator_delete((void *)local_5c0,(ulong)(local_5b8._8_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)(auStack_250 + 0x10));
        }
      }
      else {
LAB_0022f7a5:
        if ((iVar16 != 3) && (iVar16 != 0)) {
          bVar13 = false;
          goto LAB_0022f7ca;
        }
      }
      p_Var23 = (_Base_ptr)::std::_Rb_tree_increment(p_Var23);
    } while (p_Var23 != p_Var25);
    bVar13 = true;
  }
LAB_0022f7ca:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_508,(_Link_type)local_508._16_8_);
  return bVar13;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float3>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float3 *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float3,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float3, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float3, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}